

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_irom.h
# Opt level: O2

void __thiscall n_e_s::core::test::MockIRom::MockIRom(MockIRom *this)

{
  IRom *pIVar1;
  
  builtin_memcpy((this->super_IRom).header_.nes,"NES\x1a",4);
  (this->super_IRom).header_.prg_rom_size = '\0';
  (this->super_IRom).header_.chr_rom_size = '\0';
  (this->super_IRom).header_.flags_6 = '\0';
  (this->super_IRom).header_.flags_7 = '\0';
  (this->super_IRom).header_.prg_ram_size = '\0';
  (this->super_IRom).header_.flags_9 = '\0';
  (this->super_IRom).header_.flags_10 = '\0';
  (this->super_IRom).header_.zeros[0] = '\0';
  pIVar1 = &this->super_IRom;
  (pIVar1->header_).zeros[1] = '\0';
  (pIVar1->header_).zeros[2] = '\0';
  (pIVar1->header_).zeros[3] = '\0';
  (pIVar1->header_).zeros[4] = '\0';
  (this->super_IRom)._vptr_IRom = (_func_int **)&PTR__MockIRom_00274b48;
  testing::internal::FunctionMocker<bool_(unsigned_short)>::FunctionMocker
            (&this->gmock11_is_cpu_address_in_range_16);
  testing::internal::FunctionMocker<unsigned_char_(unsigned_short)>::FunctionMocker
            (&this->gmock11_cpu_read_byte_17);
  testing::internal::FunctionMocker<void_(unsigned_short,_unsigned_char)>::FunctionMocker
            (&this->gmock02_cpu_write_byte_21);
  testing::internal::FunctionMocker<bool_(unsigned_short)>::FunctionMocker
            (&this->gmock11_is_ppu_address_in_range_26);
  testing::internal::FunctionMocker<unsigned_char_(unsigned_short)>::FunctionMocker
            (&this->gmock11_ppu_read_byte_27);
  testing::internal::FunctionMocker<void_(unsigned_short,_unsigned_char)>::FunctionMocker
            (&this->gmock02_ppu_write_byte_31);
  return;
}

Assistant:

MockIRom() : IRom(INesHeader()) {}